

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 uVar2;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  size_t k;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  int iVar18;
  long lVar19;
  undefined4 uVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  NodeRef *pNVar27;
  bool bVar28;
  vint4 ai_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar37;
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_3;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar53;
  float fVar54;
  vint4 bi_2;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar55;
  vint4 bi_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_3;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  uint uVar94;
  undefined1 auVar95 [16];
  uint uVar100;
  undefined1 auVar96 [16];
  uint uVar98;
  uint uVar99;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  Precalculations pre;
  undefined1 local_3808 [16];
  undefined1 local_37f8 [16];
  undefined1 local_37c8 [16];
  Geometry *local_37b8;
  RayK<4> *local_37b0;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_3758 [16];
  undefined1 local_3748 [8];
  float fStack_3740;
  float fStack_373c;
  undefined8 local_3708;
  undefined8 uStack_3700;
  RTCHitN local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  undefined1 local_3698 [16];
  uint local_3688;
  uint uStack_3684;
  uint uStack_3680;
  uint uStack_367c;
  uint uStack_3678;
  uint uStack_3674;
  uint uStack_3670;
  uint uStack_366c;
  undefined1 local_3668 [16];
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined1 local_3648 [16];
  float local_3638;
  float fStack_3634;
  float fStack_3630;
  float fStack_362c;
  float local_3628;
  float fStack_3624;
  float fStack_3620;
  float fStack_361c;
  float local_3618;
  float fStack_3614;
  float fStack_3610;
  float fStack_360c;
  float local_3608;
  float fStack_3604;
  float fStack_3600;
  float fStack_35fc;
  float local_35f8;
  float fStack_35f4;
  float fStack_35f0;
  float fStack_35ec;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar82 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar36 = vpcmpeqd_avx(auVar82,(undefined1  [16])valid_i->field_0);
    auVar35 = ZEXT816(0) << 0x40;
    auVar50 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar35,5);
    auVar74 = auVar36 & auVar50;
    if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar74[0xf] < '\0')
    {
      local_3648 = vandps_avx(auVar50,auVar36);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar90,1);
      auVar36 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar90,auVar50);
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar90,1);
      auVar74 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar90,auVar50);
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar101);
      auVar50 = vcmpps_avx(auVar50,auVar90,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar90,auVar50);
      auVar63 = vrcpps_avx(auVar36);
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = &DAT_3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar36 = vfnmadd213ps_fma(auVar36,auVar63,auVar91);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar36,auVar63,auVar63)
      ;
      auVar36 = vrcpps_avx(auVar74);
      auVar74 = vfnmadd213ps_fma(auVar74,auVar36,auVar91);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar74,auVar36,auVar36)
      ;
      auVar36 = vrcpps_avx(auVar50);
      auVar50 = vfnmadd213ps_fma(auVar50,auVar36,auVar91);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar36,auVar36)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar35,1);
      auVar36._8_4_ = 0x20;
      auVar36._0_8_ = 0x2000000020;
      auVar36._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar36);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar35,5);
      auVar74._8_4_ = 0x40;
      auVar74._0_8_ = 0x4000000040;
      auVar74._12_4_ = 0x40;
      auVar63._8_4_ = 0x60;
      auVar63._0_8_ = 0x6000000060;
      auVar63._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar63,auVar74,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar35,5);
      auVar64._8_4_ = 0x80;
      auVar64._0_8_ = 0x8000000080;
      auVar64._12_4_ = 0x80;
      auVar70._8_4_ = 0xa0;
      auVar70._0_8_ = 0xa0000000a0;
      auVar70._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar70,auVar64,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar35);
      auVar36 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar35);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar93 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,local_3648);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar36,local_3648);
      terminated.field_0.i[1] = local_3648._4_4_ ^ auVar82._4_4_;
      terminated.field_0.i[0] = local_3648._0_4_ ^ auVar82._0_4_;
      terminated.field_0.i[2] = local_3648._8_4_ ^ auVar82._8_4_;
      terminated.field_0.i[3] = local_3648._12_4_ ^ auVar82._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_37b0 = ray + 0x80;
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_3658 = mm_lookupmask_ps._0_8_;
      uStack_3650 = mm_lookupmask_ps._8_8_;
      local_3668 = mm_lookupmask_ps._240_16_;
      auVar50 = vpcmpeqd_avx(local_3648,local_3648);
      auVar97 = ZEXT1664(auVar50);
LAB_00629869:
      paVar21 = &((vfloat<4> *)paVar21)[-1].field_0;
      root.ptr = pNVar27[-1].ptr;
      pNVar27 = pNVar27 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0062a5f0;
      aVar102 = *paVar21;
      auVar50 = vcmpps_avx((undefined1  [16])aVar102,(undefined1  [16])tray.tfar.field_0,1);
      uVar17 = vmovmskps_avx(auVar50);
      if (uVar17 == 0) {
LAB_0062a601:
        iVar18 = 2;
      }
      else {
        uVar23 = (ulong)(uVar17 & 0xff);
        uVar17 = POPCOUNT(uVar17 & 0xff);
        iVar18 = 0;
        if (uVar17 <= uVar25) {
          do {
            k = 0;
            for (uVar24 = uVar23; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar97 = ZEXT1664(auVar97._0_16_);
            bVar28 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[k] = -1;
            }
            uVar23 = uVar23 - 1 & uVar23;
          } while (uVar23 != 0);
          auVar50 = vpcmpeqd_avx(auVar97._0_16_,auVar97._0_16_);
          auVar97 = ZEXT1664(auVar50);
          auVar50 = auVar50 & ~(undefined1  [16])terminated.field_0;
          iVar18 = 3;
          auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar82._8_4_ = 0xff800000;
            auVar82._0_8_ = 0xff800000ff800000;
            auVar82._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar82,
                               (undefined1  [16])terminated.field_0);
            iVar18 = 2;
          }
        }
        if (uVar25 < uVar17) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0062a5f0;
              auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar102,6);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) goto LAB_0062a601;
              uVar23 = (ulong)((uint)root.ptr & 0xf);
              aVar37 = terminated.field_0;
              if (uVar23 == 8) goto LAB_0062a5b2;
              lVar26 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar24 = 0;
              auVar50 = auVar97._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_00629a9d;
            }
            auVar104 = ZEXT1664(auVar93._0_16_);
            uVar23 = 0;
            uVar24 = 8;
            do {
              uVar22 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar23 * 8);
              if (uVar22 != 8) {
                uVar20 = *(undefined4 *)(root.ptr + 0x40 + uVar23 * 4);
                auVar38._4_4_ = uVar20;
                auVar38._0_4_ = uVar20;
                auVar38._8_4_ = uVar20;
                auVar38._12_4_ = uVar20;
                auVar14._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar14._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar14._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar14._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar36 = vfmsub213ps_fma(auVar38,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar20 = *(undefined4 *)(root.ptr + 0x80 + uVar23 * 4);
                auVar65._4_4_ = uVar20;
                auVar65._0_4_ = uVar20;
                auVar65._8_4_ = uVar20;
                auVar65._12_4_ = uVar20;
                auVar15._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar15._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar15._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar15._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar74 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar20 = *(undefined4 *)(root.ptr + 0xc0 + uVar23 * 4);
                auVar75._4_4_ = uVar20;
                auVar75._0_4_ = uVar20;
                auVar75._8_4_ = uVar20;
                auVar75._12_4_ = uVar20;
                auVar16._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar35 = vfmsub213ps_fma(auVar75,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                uVar20 = *(undefined4 *)(root.ptr + 0x60 + uVar23 * 4);
                auVar87._4_4_ = uVar20;
                auVar87._0_4_ = uVar20;
                auVar87._8_4_ = uVar20;
                auVar87._12_4_ = uVar20;
                auVar63 = vfmsub213ps_fma(auVar87,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar20 = *(undefined4 *)(root.ptr + 0xa0 + uVar23 * 4);
                auVar56._4_4_ = uVar20;
                auVar56._0_4_ = uVar20;
                auVar56._8_4_ = uVar20;
                auVar56._12_4_ = uVar20;
                auVar64 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar20 = *(undefined4 *)(root.ptr + 0xe0 + uVar23 * 4);
                auVar43._4_4_ = uVar20;
                auVar43._0_4_ = uVar20;
                auVar43._8_4_ = uVar20;
                auVar43._12_4_ = uVar20;
                auVar70 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                auVar50 = vpminsd_avx(auVar36,auVar63);
                auVar82 = vpminsd_avx(auVar74,auVar64);
                auVar50 = vpmaxsd_avx(auVar50,auVar82);
                auVar82 = vpminsd_avx(auVar35,auVar70);
                auVar82 = vpmaxsd_avx(auVar50,auVar82);
                auVar50 = vpmaxsd_avx(auVar36,auVar63);
                auVar36 = vpmaxsd_avx(auVar74,auVar64);
                auVar36 = vpminsd_avx(auVar50,auVar36);
                auVar50 = vpmaxsd_avx(auVar35,auVar70);
                auVar36 = vpminsd_avx(auVar36,auVar50);
                auVar50 = vpmaxsd_avx(auVar82,(undefined1  [16])tray.tnear.field_0);
                auVar36 = vpminsd_avx(auVar36,(undefined1  [16])tray.tfar.field_0);
                auVar50 = vcmpps_avx(auVar50,auVar36,2);
                if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar50[0xf] < '\0') {
                  auVar50 = vblendvps_avx(auVar93._0_16_,auVar82,auVar50);
                  if (uVar24 != 8) {
                    pNVar27->ptr = uVar24;
                    pNVar27 = pNVar27 + 1;
                    *paVar21 = auVar104._0_16_;
                    paVar21 = paVar21 + 1;
                  }
                  auVar104 = ZEXT1664(auVar50);
                  uVar24 = uVar22;
                }
              }
              aVar102 = auVar104._0_16_;
            } while ((uVar22 != 8) && (bVar28 = uVar23 < 7, uVar23 = uVar23 + 1, bVar28));
            iVar18 = 0;
            if (uVar24 == 8) {
LAB_00629a43:
              bVar28 = false;
              iVar18 = 4;
            }
            else {
              auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar102,6);
              uVar20 = vmovmskps_avx(auVar50);
              bVar28 = true;
              if ((uint)POPCOUNT(uVar20) <= uVar25) {
                pNVar27->ptr = uVar24;
                pNVar27 = pNVar27 + 1;
                *paVar21 = aVar102;
                paVar21 = paVar21 + 1;
                goto LAB_00629a43;
              }
            }
            root.ptr = uVar24;
          } while (bVar28);
        }
      }
      goto LAB_0062a5f3;
    }
  }
  return;
  while( true ) {
    uVar24 = uVar24 + 1;
    lVar26 = lVar26 + 0xe0;
    auVar50 = auVar36;
    if (uVar23 - 8 <= uVar24) break;
LAB_00629a9d:
    lVar19 = uVar24 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar104 = ZEXT1664(auVar50);
    uVar22 = 0;
    while( true ) {
      auVar82 = auVar104._0_16_;
      uVar17 = *(uint *)(lVar26 + uVar22 * 4);
      if ((ulong)uVar17 == 0xffffffff) break;
      fVar49 = *(float *)(lVar26 + -0xc0 + uVar22 * 4);
      auVar71._4_4_ = fVar49;
      auVar71._0_4_ = fVar49;
      auVar71._8_4_ = fVar49;
      auVar71._12_4_ = fVar49;
      fVar53 = *(float *)(lVar26 + -0xb0 + uVar22 * 4);
      auVar76._4_4_ = fVar53;
      auVar76._0_4_ = fVar53;
      auVar76._8_4_ = fVar53;
      auVar76._12_4_ = fVar53;
      fVar54 = *(float *)(lVar26 + -0xa0 + uVar22 * 4);
      auVar57._4_4_ = fVar54;
      auVar57._0_4_ = fVar54;
      auVar57._8_4_ = fVar54;
      auVar57._12_4_ = fVar54;
      local_3748._4_4_ = *(float *)(lVar26 + -0x90 + uVar22 * 4);
      local_35f8 = *(float *)(lVar26 + -0x80 + uVar22 * 4);
      local_3608 = *(float *)(lVar26 + -0x70 + uVar22 * 4);
      local_37f8._4_4_ = *(undefined4 *)(lVar26 + -0x60 + uVar22 * 4);
      local_37f8._0_4_ = local_37f8._4_4_;
      local_37f8._8_4_ = local_37f8._4_4_;
      local_37f8._12_4_ = local_37f8._4_4_;
      local_3758._4_4_ = *(undefined4 *)(lVar26 + -0x50 + uVar22 * 4);
      local_3758._0_4_ = local_3758._4_4_;
      local_3758._8_4_ = local_3758._4_4_;
      local_3758._12_4_ = local_3758._4_4_;
      uVar20 = *(undefined4 *)(lVar26 + -0x40 + uVar22 * 4);
      local_3618 = *(float *)(lVar26 + -0x30 + uVar22 * 4);
      local_3628 = *(float *)(lVar26 + -0x20 + uVar22 * 4);
      local_3638 = *(float *)(lVar26 + -0x10 + uVar22 * 4);
      local_3708 = *(undefined8 *)(lVar19 + 0xd0);
      uStack_3700 = *(undefined8 *)(lVar19 + 0xd8);
      local_3748._0_4_ = local_3748._4_4_;
      fStack_3740 = (float)local_3748._4_4_;
      fStack_373c = (float)local_3748._4_4_;
      fVar5 = fVar49 - (float)local_3748._4_4_;
      fStack_3604 = local_3608;
      fStack_3600 = local_3608;
      fStack_35fc = local_3608;
      fVar6 = fVar54 - local_3608;
      auVar92._4_4_ = fVar6;
      auVar92._0_4_ = fVar6;
      auVar92._8_4_ = fVar6;
      auVar92._12_4_ = fVar6;
      fStack_3614 = local_3618;
      fStack_3610 = local_3618;
      fStack_360c = local_3618;
      fVar49 = local_3618 - fVar49;
      fVar55 = fVar6 * fVar49;
      auVar95._4_4_ = fVar49;
      auVar95._0_4_ = fVar49;
      auVar95._8_4_ = fVar49;
      auVar95._12_4_ = fVar49;
      auVar107._4_4_ = fVar5;
      auVar107._0_4_ = fVar5;
      auVar107._8_4_ = fVar5;
      auVar107._12_4_ = fVar5;
      fStack_3624 = local_3628;
      fStack_3620 = local_3628;
      fStack_361c = local_3628;
      fVar49 = local_3628 - fVar53;
      fVar5 = fVar5 * fVar49;
      auVar103._4_4_ = fVar49;
      auVar103._0_4_ = fVar49;
      auVar103._8_4_ = fVar49;
      auVar103._12_4_ = fVar49;
      fStack_35f4 = local_35f8;
      fStack_35f0 = local_35f8;
      fStack_35ec = local_35f8;
      fVar53 = fVar53 - local_35f8;
      auVar83._4_4_ = fVar53;
      auVar83._0_4_ = fVar53;
      auVar83._8_4_ = fVar53;
      auVar83._12_4_ = fVar53;
      fStack_3634 = local_3638;
      fStack_3630 = local_3638;
      fStack_362c = local_3638;
      fVar54 = local_3638 - fVar54;
      fVar53 = fVar53 * fVar54;
      auVar105._4_4_ = fVar54;
      auVar105._0_4_ = fVar54;
      auVar105._8_4_ = fVar54;
      auVar105._12_4_ = fVar54;
      auVar35._4_4_ = fVar53;
      auVar35._0_4_ = fVar53;
      auVar35._8_4_ = fVar53;
      auVar35._12_4_ = fVar53;
      auVar91 = vfmsub231ps_fma(auVar35,auVar103,auVar92);
      auVar39._4_4_ = fVar55;
      auVar39._0_4_ = fVar55;
      auVar39._8_4_ = fVar55;
      auVar39._12_4_ = fVar55;
      auVar39 = vfmsub231ps_fma(auVar39,auVar105,auVar107);
      auVar44._4_4_ = fVar5;
      auVar44._0_4_ = fVar5;
      auVar44._8_4_ = fVar5;
      auVar44._12_4_ = fVar5;
      auVar63 = vsubps_avx(auVar71,*(undefined1 (*) [16])ray);
      auVar64 = vsubps_avx(auVar76,*(undefined1 (*) [16])(ray + 0x10));
      auVar44 = vfmsub231ps_fma(auVar44,auVar95,auVar83);
      auVar70 = vsubps_avx(auVar57,*(undefined1 (*) [16])(ray + 0x20));
      auVar36 = *(undefined1 (*) [16])(ray + 0x40);
      auVar74 = *(undefined1 (*) [16])(ray + 0x50);
      auVar108._0_4_ = auVar36._0_4_ * auVar64._0_4_;
      auVar108._4_4_ = auVar36._4_4_ * auVar64._4_4_;
      auVar108._8_4_ = auVar36._8_4_ * auVar64._8_4_;
      auVar108._12_4_ = auVar36._12_4_ * auVar64._12_4_;
      auVar57 = vfmsub231ps_fma(auVar108,auVar63,auVar74);
      auVar35 = *(undefined1 (*) [16])(ray + 0x60);
      auVar88._0_4_ = auVar44._0_4_ * auVar35._0_4_;
      auVar88._4_4_ = auVar44._4_4_ * auVar35._4_4_;
      auVar88._8_4_ = auVar44._8_4_ * auVar35._8_4_;
      auVar88._12_4_ = auVar44._12_4_ * auVar35._12_4_;
      auVar90 = vfmadd231ps_fma(auVar88,auVar39,auVar74);
      auVar110._0_4_ = auVar70._0_4_ * auVar74._0_4_;
      auVar110._4_4_ = auVar70._4_4_ * auVar74._4_4_;
      auVar110._8_4_ = auVar70._8_4_ * auVar74._8_4_;
      auVar110._12_4_ = auVar70._12_4_ * auVar74._12_4_;
      auVar71 = vfmsub231ps_fma(auVar110,auVar64,auVar35);
      auVar51._0_4_ = auVar35._0_4_ * auVar63._0_4_;
      auVar51._4_4_ = auVar35._4_4_ * auVar63._4_4_;
      auVar51._8_4_ = auVar35._8_4_ * auVar63._8_4_;
      auVar51._12_4_ = auVar35._12_4_ * auVar63._12_4_;
      auVar51 = vfmsub231ps_fma(auVar51,auVar70,auVar36);
      auVar90 = vfmadd231ps_fma(auVar90,auVar91,auVar36);
      auVar58._0_4_ = fVar54 * auVar57._0_4_;
      auVar58._4_4_ = fVar54 * auVar57._4_4_;
      auVar58._8_4_ = fVar54 * auVar57._8_4_;
      auVar58._12_4_ = fVar54 * auVar57._12_4_;
      auVar104 = ZEXT1664(auVar82);
      auVar36 = vfmadd231ps_fma(auVar58,auVar51,auVar103);
      auVar74 = vfmadd231ps_fma(auVar36,auVar71,auVar95);
      auVar66._8_4_ = 0x80000000;
      auVar66._0_8_ = 0x8000000080000000;
      auVar66._12_4_ = 0x80000000;
      auVar36 = vandps_avx(auVar90,auVar66);
      uVar94 = auVar36._0_4_;
      auVar59._0_4_ = (float)(uVar94 ^ auVar74._0_4_);
      uVar98 = auVar36._4_4_;
      auVar59._4_4_ = (float)(uVar98 ^ auVar74._4_4_);
      uVar99 = auVar36._8_4_;
      auVar59._8_4_ = (float)(uVar99 ^ auVar74._8_4_);
      uVar100 = auVar36._12_4_;
      auVar59._12_4_ = (float)(uVar100 ^ auVar74._12_4_);
      auVar74 = vcmpps_avx(auVar59,_DAT_01feba10,5);
      auVar35 = auVar82 & auVar74;
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        auVar74 = vandps_avx(auVar74,auVar82);
        auVar67._0_4_ = auVar57._0_4_ * fVar6;
        auVar67._4_4_ = auVar57._4_4_ * fVar6;
        auVar67._8_4_ = auVar57._8_4_ * fVar6;
        auVar67._12_4_ = auVar57._12_4_ * fVar6;
        auVar35 = vfmadd213ps_fma(auVar83,auVar51,auVar67);
        auVar35 = vfmadd213ps_fma(auVar107,auVar71,auVar35);
        auVar85._0_4_ = (float)(uVar94 ^ auVar35._0_4_);
        auVar85._4_4_ = (float)(uVar98 ^ auVar35._4_4_);
        auVar85._8_4_ = (float)(uVar99 ^ auVar35._8_4_);
        auVar85._12_4_ = (float)(uVar100 ^ auVar35._12_4_);
        auVar35 = vcmpps_avx(auVar85,_DAT_01feba10,5);
        auVar57 = auVar74 & auVar35;
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          auVar57 = vandps_avx(auVar90,auVar101);
          auVar74 = vandps_avx(auVar74,auVar35);
          auVar35 = vsubps_avx(auVar57,auVar59);
          auVar35 = vcmpps_avx(auVar35,auVar85,5);
          auVar71 = auVar74 & auVar35;
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar71[0xf] < '\0') {
            auVar74 = vandps_avx(auVar35,auVar74);
            auVar68._0_4_ = auVar70._0_4_ * auVar44._0_4_;
            auVar68._4_4_ = auVar70._4_4_ * auVar44._4_4_;
            auVar68._8_4_ = auVar70._8_4_ * auVar44._8_4_;
            auVar68._12_4_ = auVar70._12_4_ * auVar44._12_4_;
            auVar35 = vfmadd213ps_fma(auVar64,auVar39,auVar68);
            auVar35 = vfmadd213ps_fma(auVar63,auVar91,auVar35);
            auVar69._0_4_ = (float)(uVar94 ^ auVar35._0_4_);
            auVar69._4_4_ = (float)(uVar98 ^ auVar35._4_4_);
            auVar69._8_4_ = (float)(uVar99 ^ auVar35._8_4_);
            auVar69._12_4_ = (float)(uVar100 ^ auVar35._12_4_);
            auVar73._0_4_ = auVar57._0_4_ * *(float *)(ray + 0x30);
            auVar73._4_4_ = auVar57._4_4_ * *(float *)(ray + 0x34);
            auVar73._8_4_ = auVar57._8_4_ * *(float *)(ray + 0x38);
            auVar73._12_4_ = auVar57._12_4_ * *(float *)(ray + 0x3c);
            auVar35 = vcmpps_avx(auVar73,auVar69,1);
            pRVar1 = ray + 0x80;
            auVar64 = *(undefined1 (*) [16])pRVar1;
            auVar78._0_4_ = auVar57._0_4_ * *(float *)pRVar1;
            auVar78._4_4_ = auVar57._4_4_ * *(float *)(ray + 0x84);
            auVar78._8_4_ = auVar57._8_4_ * *(float *)(ray + 0x88);
            auVar78._12_4_ = auVar57._12_4_ * *(float *)(ray + 0x8c);
            auVar63 = vcmpps_avx(auVar69,auVar78,2);
            auVar35 = vandps_avx(auVar63,auVar35);
            auVar63 = auVar74 & auVar35;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              auVar74 = vandps_avx(auVar74,auVar35);
              auVar35 = vcmpps_avx(auVar90,_DAT_01feba10,4);
              auVar63 = auVar74 & auVar35;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar74 = vandps_avx(auVar35,auVar74);
                local_37b8 = (context->scene->geometries).items[uVar17].ptr;
                uVar94 = local_37b8->mask;
                auVar79._4_4_ = uVar94;
                auVar79._0_4_ = uVar94;
                auVar79._8_4_ = uVar94;
                auVar79._12_4_ = uVar94;
                auVar35 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
                auVar35 = vpcmpeqd_avx(auVar35,_DAT_01feba10);
                auVar63 = auVar74 & ~auVar35;
                if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar63[0xf] < '\0') {
                  uVar2 = *(undefined4 *)((long)&local_3708 + uVar22 * 4);
                  auVar74 = vandnps_avx(auVar35,auVar74);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_37b8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar35 = vrcpps_avx(auVar57);
                    auVar89._8_4_ = 0x3f800000;
                    auVar89._0_8_ = &DAT_3f8000003f800000;
                    auVar89._12_4_ = 0x3f800000;
                    auVar63 = vfnmadd213ps_fma(auVar57,auVar35,auVar89);
                    auVar35 = vfmadd132ps_fma(auVar63,auVar35,auVar35);
                    fVar49 = auVar35._0_4_;
                    auVar61._0_4_ = fVar49 * auVar59._0_4_;
                    fVar53 = auVar35._4_4_;
                    auVar61._4_4_ = fVar53 * auVar59._4_4_;
                    fVar54 = auVar35._8_4_;
                    auVar61._8_4_ = fVar54 * auVar59._8_4_;
                    fVar55 = auVar35._12_4_;
                    auVar61._12_4_ = fVar55 * auVar59._12_4_;
                    auVar35 = vminps_avx(auVar61,auVar89);
                    auVar81._0_4_ = auVar85._0_4_ * fVar49;
                    auVar81._4_4_ = auVar85._4_4_ * fVar53;
                    auVar81._8_4_ = auVar85._8_4_ * fVar54;
                    auVar81._12_4_ = auVar85._12_4_ * fVar55;
                    auVar63 = vminps_avx(auVar81,auVar89);
                    auVar70 = vsubps_avx(auVar89,auVar35);
                    auVar90 = vsubps_avx(auVar89,auVar63);
                    auVar8._8_8_ = uStack_3650;
                    auVar8._0_8_ = local_3658;
                    local_36c8 = vblendvps_avx(auVar35,auVar70,auVar8);
                    local_36b8 = vblendvps_avx(auVar63,auVar90,auVar8);
                    local_3698._4_4_ = uVar17;
                    local_3698._0_4_ = uVar17;
                    local_3698._8_4_ = uVar17;
                    local_3698._12_4_ = uVar17;
                    local_36a8._4_4_ = uVar2;
                    local_36a8._0_4_ = uVar2;
                    local_36a8._8_4_ = uVar2;
                    local_36a8._12_4_ = uVar2;
                    local_36f8[0] = (RTCHitN)auVar91[0];
                    local_36f8[1] = (RTCHitN)auVar91[1];
                    local_36f8[2] = (RTCHitN)auVar91[2];
                    local_36f8[3] = (RTCHitN)auVar91[3];
                    local_36f8[4] = (RTCHitN)auVar91[4];
                    local_36f8[5] = (RTCHitN)auVar91[5];
                    local_36f8[6] = (RTCHitN)auVar91[6];
                    local_36f8[7] = (RTCHitN)auVar91[7];
                    local_36f8[8] = (RTCHitN)auVar91[8];
                    local_36f8[9] = (RTCHitN)auVar91[9];
                    local_36f8[10] = (RTCHitN)auVar91[10];
                    local_36f8[0xb] = (RTCHitN)auVar91[0xb];
                    local_36f8[0xc] = (RTCHitN)auVar91[0xc];
                    local_36f8[0xd] = (RTCHitN)auVar91[0xd];
                    local_36f8[0xe] = (RTCHitN)auVar91[0xe];
                    local_36f8[0xf] = (RTCHitN)auVar91[0xf];
                    local_36e8 = auVar39;
                    local_36d8 = auVar44;
                    vpcmpeqd_avx2(ZEXT1632(auVar91),ZEXT1632(auVar91));
                    uStack_3684 = context->user->instID[0];
                    local_3688 = uStack_3684;
                    uStack_3680 = uStack_3684;
                    uStack_367c = uStack_3684;
                    uStack_3678 = context->user->instPrimID[0];
                    auVar40._0_4_ = fVar49 * auVar69._0_4_;
                    auVar40._4_4_ = fVar53 * auVar69._4_4_;
                    auVar40._8_4_ = fVar54 * auVar69._8_4_;
                    auVar40._12_4_ = fVar55 * auVar69._12_4_;
                    uStack_3674 = uStack_3678;
                    uStack_3670 = uStack_3678;
                    uStack_366c = uStack_3678;
                    auVar35 = vblendvps_avx(*(undefined1 (*) [16])pRVar1,auVar40,auVar74);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar35;
                    args.valid = (int *)local_37c8;
                    args.geometryUserPtr = local_37b8->userPtr;
                    args.context = context->user;
                    args.hit = local_36f8;
                    args.N = 4;
                    local_37c8 = auVar74;
                    args.ray = (RTCRayN *)ray;
                    if (local_37b8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_37b8->occlusionFilterN)(&args);
                    }
                    if (local_37c8 == (undefined1  [16])0x0) {
                      auVar74 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar74 = auVar74 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_37b8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar35 = vpcmpeqd_avx((undefined1  [16])0x0,local_37c8);
                      auVar74 = auVar35 ^ _DAT_01febe20;
                      auVar46._8_4_ = 0xff800000;
                      auVar46._0_8_ = 0xff800000ff800000;
                      auVar46._12_4_ = 0xff800000;
                      auVar35 = vblendvps_avx(auVar46,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar35);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar35;
                    }
                    auVar35 = vpslld_avx(auVar74,0x1f);
                    auVar74 = vpsrad_avx(auVar35,0x1f);
                    auVar35 = vblendvps_avx(auVar64,*(undefined1 (*) [16])local_37b0,auVar35);
                    *(undefined1 (*) [16])local_37b0 = auVar35;
                  }
                  auVar82 = vpandn_avx(auVar74,auVar82);
                  auVar104 = ZEXT1664(auVar82);
                  goto LAB_00629c88;
                }
              }
            }
          }
          auVar104 = ZEXT1664(auVar82);
        }
      }
LAB_00629c88:
      local_3808 = auVar104._0_16_;
      if ((((local_3808 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_3808 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_3808 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < auVar104[0xf]) {
        bVar28 = false;
        auVar36 = vpcmpeqd_avx(auVar36,auVar36);
      }
      else {
        auVar11._4_4_ = fStack_3614;
        auVar11._0_4_ = local_3618;
        auVar11._8_4_ = fStack_3610;
        auVar11._12_4_ = fStack_360c;
        auVar35 = vsubps_avx(local_37f8,auVar11);
        auVar10._4_4_ = fStack_3624;
        auVar10._0_4_ = local_3628;
        auVar10._8_4_ = fStack_3620;
        auVar10._12_4_ = fStack_361c;
        auVar63 = vsubps_avx(local_3758,auVar10);
        auVar7._4_4_ = uVar20;
        auVar7._0_4_ = uVar20;
        auVar7._8_4_ = uVar20;
        auVar7._12_4_ = uVar20;
        auVar9._4_4_ = fStack_3634;
        auVar9._0_4_ = local_3638;
        auVar9._8_4_ = fStack_3630;
        auVar9._12_4_ = fStack_362c;
        auVar64 = vsubps_avx(auVar7,auVar9);
        auVar70 = vsubps_avx(_local_3748,local_37f8);
        auVar13._4_4_ = fStack_35f4;
        auVar13._0_4_ = local_35f8;
        auVar13._8_4_ = fStack_35f0;
        auVar13._12_4_ = fStack_35ec;
        auVar90 = vsubps_avx(auVar13,local_3758);
        auVar12._4_4_ = fStack_3604;
        auVar12._0_4_ = local_3608;
        auVar12._8_4_ = fStack_3600;
        auVar12._12_4_ = fStack_35fc;
        auVar91 = vsubps_avx(auVar12,auVar7);
        auVar45._0_4_ = auVar63._0_4_ * auVar91._0_4_;
        auVar45._4_4_ = auVar63._4_4_ * auVar91._4_4_;
        auVar45._8_4_ = auVar63._8_4_ * auVar91._8_4_;
        auVar45._12_4_ = auVar63._12_4_ * auVar91._12_4_;
        auVar51 = vfmsub231ps_fma(auVar45,auVar90,auVar64);
        auVar77._0_4_ = auVar64._0_4_ * auVar70._0_4_;
        auVar77._4_4_ = auVar64._4_4_ * auVar70._4_4_;
        auVar77._8_4_ = auVar64._8_4_ * auVar70._8_4_;
        auVar77._12_4_ = auVar64._12_4_ * auVar70._12_4_;
        auVar58 = vfmsub231ps_fma(auVar77,auVar91,auVar35);
        auVar52._0_4_ = auVar90._0_4_ * auVar35._0_4_;
        auVar52._4_4_ = auVar90._4_4_ * auVar35._4_4_;
        auVar52._8_4_ = auVar90._8_4_ * auVar35._8_4_;
        auVar52._12_4_ = auVar90._12_4_ * auVar35._12_4_;
        auVar39 = vsubps_avx(local_37f8,*(undefined1 (*) [16])ray);
        auVar44 = vsubps_avx(local_3758,*(undefined1 (*) [16])(ray + 0x10));
        auVar57 = vsubps_avx(auVar7,*(undefined1 (*) [16])(ray + 0x20));
        auVar59 = vfmsub231ps_fma(auVar52,auVar70,auVar63);
        auVar82 = *(undefined1 (*) [16])(ray + 0x40);
        auVar36 = *(undefined1 (*) [16])(ray + 0x50);
        auVar106._0_4_ = auVar44._0_4_ * auVar82._0_4_;
        auVar106._4_4_ = auVar44._4_4_ * auVar82._4_4_;
        auVar106._8_4_ = auVar44._8_4_ * auVar82._8_4_;
        auVar106._12_4_ = auVar44._12_4_ * auVar82._12_4_;
        auVar76 = vfmsub231ps_fma(auVar106,auVar39,auVar36);
        auVar74 = *(undefined1 (*) [16])(ray + 0x60);
        auVar84._0_4_ = auVar74._0_4_ * auVar59._0_4_;
        auVar84._4_4_ = auVar74._4_4_ * auVar59._4_4_;
        auVar84._8_4_ = auVar74._8_4_ * auVar59._8_4_;
        auVar84._12_4_ = auVar74._12_4_ * auVar59._12_4_;
        auVar71 = vfmadd231ps_fma(auVar84,auVar58,auVar36);
        auVar109._0_4_ = auVar36._0_4_ * auVar57._0_4_;
        auVar109._4_4_ = auVar36._4_4_ * auVar57._4_4_;
        auVar109._8_4_ = auVar36._8_4_ * auVar57._8_4_;
        auVar109._12_4_ = auVar36._12_4_ * auVar57._12_4_;
        auVar83 = vfmsub231ps_fma(auVar109,auVar44,auVar74);
        auVar111._0_4_ = auVar74._0_4_ * auVar39._0_4_;
        auVar111._4_4_ = auVar74._4_4_ * auVar39._4_4_;
        auVar111._8_4_ = auVar74._8_4_ * auVar39._8_4_;
        auVar111._12_4_ = auVar74._12_4_ * auVar39._12_4_;
        auVar88 = vfmsub231ps_fma(auVar111,auVar57,auVar82);
        auVar74 = vfmadd231ps_fma(auVar71,auVar51,auVar82);
        auVar29._0_4_ = auVar91._0_4_ * auVar76._0_4_;
        auVar29._4_4_ = auVar91._4_4_ * auVar76._4_4_;
        auVar29._8_4_ = auVar91._8_4_ * auVar76._8_4_;
        auVar29._12_4_ = auVar91._12_4_ * auVar76._12_4_;
        auVar82 = vfmadd231ps_fma(auVar29,auVar88,auVar90);
        auVar96 = vandps_avx(auVar74,auVar66);
        auVar82 = vfmadd231ps_fma(auVar82,auVar83,auVar70);
        uVar17 = auVar96._0_4_;
        auVar60._0_4_ = (float)(uVar17 ^ auVar82._0_4_);
        uVar94 = auVar96._4_4_;
        auVar60._4_4_ = (float)(uVar94 ^ auVar82._4_4_);
        uVar98 = auVar96._8_4_;
        auVar60._8_4_ = (float)(uVar98 ^ auVar82._8_4_);
        uVar99 = auVar96._12_4_;
        auVar60._12_4_ = (float)(uVar99 ^ auVar82._12_4_);
        auVar82 = vcmpps_avx(auVar60,_DAT_01feba10,5);
        auVar36 = local_3808 & auVar82;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar82 = vandps_avx(auVar82,local_3808);
          auVar30._0_4_ = auVar64._0_4_ * auVar76._0_4_;
          auVar30._4_4_ = auVar64._4_4_ * auVar76._4_4_;
          auVar30._8_4_ = auVar64._8_4_ * auVar76._8_4_;
          auVar30._12_4_ = auVar64._12_4_ * auVar76._12_4_;
          auVar36 = vfmadd213ps_fma(auVar63,auVar88,auVar30);
          auVar36 = vfmadd213ps_fma(auVar35,auVar83,auVar36);
          auVar72._0_4_ = (float)(uVar17 ^ auVar36._0_4_);
          auVar72._4_4_ = (float)(uVar94 ^ auVar36._4_4_);
          auVar72._8_4_ = (float)(uVar98 ^ auVar36._8_4_);
          auVar72._12_4_ = (float)(uVar99 ^ auVar36._12_4_);
          auVar36 = vcmpps_avx(auVar72,_DAT_01feba10,5);
          auVar35 = auVar82 & auVar36;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar35 = vandps_avx(auVar74,auVar101);
            auVar82 = vandps_avx(auVar36,auVar82);
            auVar36 = vsubps_avx(auVar35,auVar60);
            auVar36 = vcmpps_avx(auVar36,auVar72,5);
            auVar63 = auVar82 & auVar36;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              auVar82 = vandps_avx(auVar36,auVar82);
              auVar31._0_4_ = auVar57._0_4_ * auVar59._0_4_;
              auVar31._4_4_ = auVar57._4_4_ * auVar59._4_4_;
              auVar31._8_4_ = auVar57._8_4_ * auVar59._8_4_;
              auVar31._12_4_ = auVar57._12_4_ * auVar59._12_4_;
              auVar36 = vfmadd213ps_fma(auVar44,auVar58,auVar31);
              auVar36 = vfmadd213ps_fma(auVar39,auVar51,auVar36);
              auVar96._0_4_ = (float)(uVar17 ^ auVar36._0_4_);
              auVar96._4_4_ = (float)(uVar94 ^ auVar36._4_4_);
              auVar96._8_4_ = (float)(uVar98 ^ auVar36._8_4_);
              auVar96._12_4_ = (float)(uVar99 ^ auVar36._12_4_);
              auVar32._0_4_ = auVar35._0_4_ * *(float *)(ray + 0x30);
              auVar32._4_4_ = auVar35._4_4_ * *(float *)(ray + 0x34);
              auVar32._8_4_ = auVar35._8_4_ * *(float *)(ray + 0x38);
              auVar32._12_4_ = auVar35._12_4_ * *(float *)(ray + 0x3c);
              auVar36 = vcmpps_avx(auVar32,auVar96,1);
              pRVar1 = ray + 0x80;
              auVar64 = *(undefined1 (*) [16])pRVar1;
              auVar80._0_4_ = auVar35._0_4_ * *(float *)pRVar1;
              auVar80._4_4_ = auVar35._4_4_ * *(float *)(ray + 0x84);
              auVar80._8_4_ = auVar35._8_4_ * *(float *)(ray + 0x88);
              auVar80._12_4_ = auVar35._12_4_ * *(float *)(ray + 0x8c);
              auVar63 = vcmpps_avx(auVar96,auVar80,2);
              auVar36 = vandps_avx(auVar63,auVar36);
              auVar63 = auVar82 & auVar36;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar82 = vandps_avx(auVar82,auVar36);
                auVar36 = vcmpps_avx(auVar74,_DAT_01feba10,4);
                auVar74 = auVar82 & auVar36;
                if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar74[0xf] < '\0') {
                  auVar82 = vandps_avx(auVar36,auVar82);
                  uVar94 = *(uint *)(lVar26 + uVar22 * 4);
                  pGVar3 = (context->scene->geometries).items[uVar94].ptr;
                  uVar17 = pGVar3->mask;
                  auVar33._4_4_ = uVar17;
                  auVar33._0_4_ = uVar17;
                  auVar33._8_4_ = uVar17;
                  auVar33._12_4_ = uVar17;
                  auVar36 = vpand_avx(auVar33,*(undefined1 (*) [16])(ray + 0x90));
                  auVar36 = vpcmpeqd_avx(auVar36,_DAT_01feba10);
                  auVar74 = auVar82 & ~auVar36;
                  if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar74[0xf] < '\0') {
                    uVar20 = *(undefined4 *)((long)&local_3708 + uVar22 * 4);
                    auVar82 = vandnps_avx(auVar36,auVar82);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar36 = vrcpps_avx(auVar35);
                      auVar86._8_4_ = 0x3f800000;
                      auVar86._0_8_ = &DAT_3f8000003f800000;
                      auVar86._12_4_ = 0x3f800000;
                      auVar74 = vfnmadd213ps_fma(auVar35,auVar36,auVar86);
                      auVar36 = vfmadd132ps_fma(auVar74,auVar36,auVar36);
                      fVar49 = auVar36._0_4_;
                      auVar34._0_4_ = fVar49 * auVar60._0_4_;
                      fVar53 = auVar36._4_4_;
                      auVar34._4_4_ = fVar53 * auVar60._4_4_;
                      fVar54 = auVar36._8_4_;
                      auVar34._8_4_ = fVar54 * auVar60._8_4_;
                      fVar55 = auVar36._12_4_;
                      auVar34._12_4_ = fVar55 * auVar60._12_4_;
                      auVar36 = vminps_avx(auVar34,auVar86);
                      auVar62._0_4_ = fVar49 * auVar72._0_4_;
                      auVar62._4_4_ = fVar53 * auVar72._4_4_;
                      auVar62._8_4_ = fVar54 * auVar72._8_4_;
                      auVar62._12_4_ = fVar55 * auVar72._12_4_;
                      auVar74 = vminps_avx(auVar62,auVar86);
                      auVar35 = vsubps_avx(auVar86,auVar36);
                      auVar63 = vsubps_avx(auVar86,auVar74);
                      local_36c8 = vblendvps_avx(auVar36,auVar35,local_3668);
                      local_36b8 = vblendvps_avx(auVar74,auVar63,local_3668);
                      local_3698._4_4_ = uVar94;
                      local_3698._0_4_ = uVar94;
                      local_3698._8_4_ = uVar94;
                      local_3698._12_4_ = uVar94;
                      local_36a8._4_4_ = uVar20;
                      local_36a8._0_4_ = uVar20;
                      local_36a8._8_4_ = uVar20;
                      local_36a8._12_4_ = uVar20;
                      local_36f8[0] = (RTCHitN)auVar51[0];
                      local_36f8[1] = (RTCHitN)auVar51[1];
                      local_36f8[2] = (RTCHitN)auVar51[2];
                      local_36f8[3] = (RTCHitN)auVar51[3];
                      local_36f8[4] = (RTCHitN)auVar51[4];
                      local_36f8[5] = (RTCHitN)auVar51[5];
                      local_36f8[6] = (RTCHitN)auVar51[6];
                      local_36f8[7] = (RTCHitN)auVar51[7];
                      local_36f8[8] = (RTCHitN)auVar51[8];
                      local_36f8[9] = (RTCHitN)auVar51[9];
                      local_36f8[10] = (RTCHitN)auVar51[10];
                      local_36f8[0xb] = (RTCHitN)auVar51[0xb];
                      local_36f8[0xc] = (RTCHitN)auVar51[0xc];
                      local_36f8[0xd] = (RTCHitN)auVar51[0xd];
                      local_36f8[0xe] = (RTCHitN)auVar51[0xe];
                      local_36f8[0xf] = (RTCHitN)auVar51[0xf];
                      local_36e8 = auVar58;
                      local_36d8 = auVar59;
                      vpcmpeqd_avx2(ZEXT1632(local_36c8),ZEXT1632(local_36c8));
                      uStack_3684 = context->user->instID[0];
                      local_3688 = uStack_3684;
                      uStack_3680 = uStack_3684;
                      uStack_367c = uStack_3684;
                      uStack_3678 = context->user->instPrimID[0];
                      auVar41._0_4_ = fVar49 * auVar96._0_4_;
                      auVar41._4_4_ = fVar53 * auVar96._4_4_;
                      auVar41._8_4_ = fVar54 * auVar96._8_4_;
                      auVar41._12_4_ = fVar55 * auVar96._12_4_;
                      uStack_3674 = uStack_3678;
                      uStack_3670 = uStack_3678;
                      uStack_366c = uStack_3678;
                      auVar36 = vblendvps_avx(*(undefined1 (*) [16])pRVar1,auVar41,auVar82);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar36;
                      args.valid = (int *)local_37c8;
                      args.geometryUserPtr = pGVar3->userPtr;
                      args.context = context->user;
                      args.hit = local_36f8;
                      args.N = 4;
                      local_37c8 = auVar82;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar3->occlusionFilterN)(&args);
                      }
                      if (local_37c8 == (undefined1  [16])0x0) {
                        auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar82 = auVar82 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var4)(&args);
                        }
                        auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,local_37c8);
                        auVar82 = auVar36 ^ _DAT_01febe20;
                        auVar47._8_4_ = 0xff800000;
                        auVar47._0_8_ = 0xff800000ff800000;
                        auVar47._12_4_ = 0xff800000;
                        auVar36 = vblendvps_avx(auVar47,*(undefined1 (*) [16])(args.ray + 0x80),
                                                auVar36);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                      }
                      auVar36 = vpslld_avx(auVar82,0x1f);
                      auVar82 = vpsrad_avx(auVar36,0x1f);
                      auVar36 = vblendvps_avx(auVar64,*(undefined1 (*) [16])local_37b0,auVar36);
                      *(undefined1 (*) [16])local_37b0 = auVar36;
                    }
                    local_3808 = vpandn_avx(auVar82,local_3808);
                  }
                }
              }
            }
          }
        }
        auVar104 = ZEXT1664(local_3808);
        bVar28 = (((local_3808 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (local_3808 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_3808 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 local_3808[0xf] < '\0';
        auVar36 = vpcmpeqd_avx(auVar96,auVar96);
      }
      auVar82 = auVar104._0_16_;
      auVar97 = ZEXT1664(auVar36);
      auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((!bVar28) || (bVar28 = 2 < uVar22, uVar22 = uVar22 + 1, bVar28)) break;
    }
    auVar36 = vpand_avx(auVar82,auVar50);
    auVar50 = auVar50 & auVar82;
    if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
    break;
  }
  aVar37 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar97._0_16_ ^ auVar36);
LAB_0062a5b2:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])aVar37,(undefined1  [16])terminated.field_0);
  auVar50 = auVar97._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf]) {
LAB_0062a5f0:
    iVar18 = 3;
  }
  else {
    auVar48._8_4_ = 0xff800000;
    auVar48._0_8_ = 0xff800000ff800000;
    auVar48._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                       (undefined1  [16])terminated.field_0);
    iVar18 = 0;
  }
LAB_0062a5f3:
  if (iVar18 == 3) {
    auVar50 = vandps_avx(local_3648,(undefined1  [16])terminated.field_0);
    auVar42._8_4_ = 0xff800000;
    auVar42._0_8_ = 0xff800000ff800000;
    auVar42._12_4_ = 0xff800000;
    auVar50 = vmaskmovps_avx(auVar50,auVar42);
    *(undefined1 (*) [16])local_37b0 = auVar50;
    return;
  }
  goto LAB_00629869;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }